

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_bufput_bufstr(jit_State *J)

{
  uint uVar1;
  TRef TVar2;
  IRIns *pIVar3;
  IRIns *pIVar4;
  IRIns *pIVar5;
  IRIns *carg2;
  IRIns *carg1;
  IRIns *ir;
  IRRef ref;
  IRRef hdr;
  jit_State *J_local;
  
  if ((J->flags & 0x80000) != 0) {
    uVar1 = (uint)(J->fold).right[0].field_0.op2;
    if (((((J->fold).left[0].field_1.o == 'U') && ((J->fold).left[0].field_0.op2 == 0)) &&
        ((J->fold).left[0].field_0.prev == uVar1)) &&
       ((J->fold).left[0].field_0.op1 == (J->cur).ir[uVar1].field_0.op1)) {
      uVar1 = (uint)(J->fold).ins.field_0.op1;
      *(undefined2 *)((long)(J->cur).ir + (ulong)uVar1 * 8 + 2) = 1;
      (J->cur).ir[uVar1].field_0.op1 = (J->fold).right[0].field_0.op1;
      return uVar1;
    }
    if (((*(short *)((long)(J->cur).ir + (ulong)uVar1 * 8 + 2) == 0) &&
        (pIVar3 = (J->cur).ir + (J->fold).right[0].field_0.op1, (pIVar3->field_1).o == 'a')) &&
       ((0x12 < (pIVar3->field_0).op2 && ((pIVar3->field_0).op2 < 0x17)))) {
      pIVar4 = (J->cur).ir + (pIVar3->field_0).op1;
      if ((pIVar3->field_0).op2 == 0x16) {
        pIVar5 = (J->cur).ir + (pIVar4->field_0).op1;
        if ((pIVar5->field_0).op1 == uVar1) {
          TVar2 = lj_ir_call(J,(uint)(pIVar3->field_0).op2,(ulong)(J->fold).ins.field_0.op1,
                             (ulong)(pIVar5->field_0).op2,(ulong)(pIVar4->field_0).op2);
          return TVar2;
        }
      }
      else if ((pIVar4->field_0).op1 == uVar1) {
        TVar2 = lj_ir_call(J,(uint)(pIVar3->field_0).op2,(ulong)(J->fold).ins.field_0.op1,
                           (ulong)(pIVar4->field_0).op2);
        return TVar2;
      }
    }
  }
  TVar2 = lj_ir_emit(J);
  return TVar2;
}

Assistant:

LJFOLD(BUFPUT any BUFSTR)
LJFOLDF(bufput_bufstr)
{
  if ((J->flags & JIT_F_OPT_FWD)) {
    IRRef hdr = fright->op2;
    /* New buffer, no other buffer op inbetween and same buffer? */
    if (fleft->o == IR_BUFHDR && fleft->op2 == IRBUFHDR_RESET &&
	fleft->prev == hdr &&
	fleft->op1 == IR(hdr)->op1) {
      IRRef ref = fins->op1;
      IR(ref)->op2 = IRBUFHDR_APPEND;  /* Modify BUFHDR. */
      IR(ref)->op1 = fright->op1;
      return ref;
    }
    /* Replay puts to global temporary buffer. */
    if (IR(hdr)->op2 == IRBUFHDR_RESET) {
      IRIns *ir = IR(fright->op1);
      /* For now only handle single string.reverse .lower .upper .rep. */
      if (ir->o == IR_CALLL &&
	  ir->op2 >= IRCALL_lj_buf_putstr_reverse &&
	  ir->op2 <= IRCALL_lj_buf_putstr_rep) {
	IRIns *carg1 = IR(ir->op1);
	if (ir->op2 == IRCALL_lj_buf_putstr_rep) {
	  IRIns *carg2 = IR(carg1->op1);
	  if (carg2->op1 == hdr) {
	    return lj_ir_call(J, ir->op2, fins->op1, carg2->op2, carg1->op2);
	  }
	} else if (carg1->op1 == hdr) {
	  return lj_ir_call(J, ir->op2, fins->op1, carg1->op2);
	}
      }
    }
  }
  return EMITFOLD;  /* Always emit, CSE later. */
}